

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_alloc.c
# Opt level: O2

char * string_alloc(string_alloc_t *a_str,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  string_t *psVar4;
  char *pcVar5;
  
  if (length == 0) {
    return (char *)0x0;
  }
  sVar2 = a_str->nstrings;
  if (sVar2 != 0) {
    psVar4 = a_str->strings;
    sVar3 = psVar4[sVar2 - 1].used;
    uVar1 = sVar3 + length;
    if (uVar1 < a_str->max_length) {
      pcVar5 = psVar4[sVar2 - 1].str;
      psVar4[sVar2 - 1].used = uVar1;
      return pcVar5 + sVar3;
    }
  }
  if (a_str->max_length < length) {
    a_str->max_length = length;
  }
  psVar4 = (string_t *)realloc(a_str->strings,sVar2 * 0x10 + 0x10);
  if (psVar4 != (string_t *)0x0) {
    a_str->strings = psVar4;
    sVar2 = a_str->nstrings;
    pcVar5 = (char *)malloc(a_str->max_length);
    psVar4[sVar2].str = pcVar5;
    if (pcVar5 != (char *)0x0) {
      a_str->nstrings = sVar2 + 1;
      psVar4[sVar2].used = length;
      return pcVar5;
    }
  }
  return (char *)0x0;
}

Assistant:

char *string_alloc(string_alloc_t *a_str, size_t length) {
    string_t *str;
    char *ret;
    
    if (length <= 0) return NULL;
    
    // add to last string pool if we have space
    if (a_str->nstrings) {
    	str = &a_str->strings[a_str->nstrings - 1];
	
	if (str->used + length < a_str->max_length) {
	    ret = str->str + str->used;
	    str->used += length;
	    return ret;
	}
    }
    
    // increase the max length if needs be
    if (length > a_str->max_length) a_str->max_length = length;
	
    // need a new string pool 
    str = new_string_pool(a_str);
    
    if (NULL == str) return NULL;
    
    str->used = length;
    return str->str;
}